

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O0

void write2file(string *output,double *p_value_dp,int m)

{
  byte bVar1;
  ostream *poVar2;
  int in_EDX;
  long in_RSI;
  int k;
  ofstream myfile;
  int local_228;
  ostream local_218 [516];
  int local_14;
  long local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::ofstream::ofstream();
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator<<((ostream *)&std::cout,"Unable to open file");
  }
  else {
    poVar2 = std::operator<<(local_218,"k");
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,"DP");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    for (local_228 = 0; local_228 <= local_14; local_228 = local_228 + 1) {
      poVar2 = (ostream *)std::ostream::operator<<(local_218,local_228);
      poVar2 = std::operator<<(poVar2,"\t");
      poVar2 = (ostream *)
               std::ostream::operator<<(poVar2,*(double *)(local_10 + (long)local_228 * 8));
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void write2file(string output, double* p_value_dp, int m)
{
    ofstream myfile (output);
    if (myfile.is_open()) {
        myfile << "k" << "\t" << "DP" << endl;
        for(int k=0; k<=m; k++){
            myfile << k << "\t" << p_value_dp[k] << endl;
        }
        myfile.close();
        }
    else cout << "Unable to open file";
}